

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXSingleStray(ndicapi *pol,int port,double *coord)

{
  char (*cp) [24];
  long lVar1;
  char *dp;
  double *coord_local;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    pol_local._4_4_ = 1;
  }
  else {
    cp = pol->GxSingleStray + (port + -0x31);
    if (((*cp)[0] == 'D') || ((*cp)[0] == '\0')) {
      pol_local._4_4_ = 1;
    }
    else if ((*cp)[0] == 'M') {
      pol_local._4_4_ = 2;
    }
    else {
      lVar1 = ndiSignedToLong(*cp,7);
      *coord = (double)lVar1 * 0.01;
      lVar1 = ndiSignedToLong(*cp + 7,7);
      coord[1] = (double)lVar1 * 0.01;
      lVar1 = ndiSignedToLong(*cp + 0xe,7);
      coord[2] = (double)lVar1 * 0.01;
      pol_local._4_4_ = 0;
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetGXSingleStray(ndicapi* pol, int port, double coord[3])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxSingleStray[port - '1'];
  }
  else
  {
    return NDI_DISABLED;
  }

  if (*dp == 'D' || *dp == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*dp == 'M')
  {
    return NDI_MISSING;
  }

  coord[0] = ndiSignedToLong(&dp[0],  7) * 0.01;
  coord[1] = ndiSignedToLong(&dp[7],  7) * 0.01;
  coord[2] = ndiSignedToLong(&dp[14], 7) * 0.01;

  return NDI_OKAY;
}